

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O2

int nghttp3_qpack_decoder_set_max_dtable_capacity
              (nghttp3_qpack_decoder *decoder,size_t max_dtable_capacity)

{
  nghttp3_mem *mem;
  size_t sVar1;
  nghttp3_qpack_entry *ent;
  int iVar2;
  undefined8 *puVar3;
  
  if ((decoder->ctx).hard_max_dtable_capacity < max_dtable_capacity) {
    iVar2 = -0x65;
  }
  else {
    mem = (decoder->ctx).mem;
    (decoder->ctx).max_dtable_capacity = max_dtable_capacity;
    while (max_dtable_capacity < (decoder->ctx).dtable_size) {
      sVar1 = (decoder->ctx).dtable.len;
      if (sVar1 == 0) {
        __assert_fail("i",
                      "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                      ,0xc3e,
                      "int nghttp3_qpack_decoder_set_max_dtable_capacity(nghttp3_qpack_decoder *, size_t)"
                     );
      }
      puVar3 = (undefined8 *)nghttp3_ringbuf_get((nghttp3_ringbuf *)decoder,sVar1 - 1);
      ent = (nghttp3_qpack_entry *)*puVar3;
      (decoder->ctx).dtable_size =
           ((decoder->ctx).dtable_size - (((ent->nv).name)->len + ((ent->nv).value)->len)) - 0x20;
      nghttp3_ringbuf_pop_back((nghttp3_ringbuf *)decoder);
      nghttp3_qpack_entry_free(ent);
      nghttp3_mem_free(mem,ent);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int nghttp3_qpack_decoder_set_max_dtable_capacity(
  nghttp3_qpack_decoder *decoder, size_t max_dtable_capacity) {
  nghttp3_qpack_entry *ent;
  size_t i;
  nghttp3_qpack_context *ctx = &decoder->ctx;
  const nghttp3_mem *mem = ctx->mem;

  if (max_dtable_capacity > decoder->ctx.hard_max_dtable_capacity) {
    return NGHTTP3_ERR_INVALID_ARGUMENT;
  }

  ctx->max_dtable_capacity = max_dtable_capacity;

  while (ctx->dtable_size > max_dtable_capacity) {
    i = nghttp3_ringbuf_len(&ctx->dtable);
    assert(i);
    ent = *(nghttp3_qpack_entry **)nghttp3_ringbuf_get(&ctx->dtable, i - 1);

    ctx->dtable_size -= table_space(ent->nv.name->len, ent->nv.value->len);

    nghttp3_ringbuf_pop_back(&ctx->dtable);
    nghttp3_qpack_entry_free(ent);
    nghttp3_mem_free(mem, ent);
  }

  return 0;
}